

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O3

string * __thiscall
pbrt::LanczosSincFilter::ToString_abi_cxx11_(string *__return_storage_ptr__,LanczosSincFilter *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::Vector2<float>const&,float_const&,pbrt::FilterSampler_const&>
            (__return_storage_ptr__,"[ LanczosSincFilter radius: %s tau: %f sampler: %s ]",
             &this->radius,&this->tau,&this->sampler);
  return __return_storage_ptr__;
}

Assistant:

std::string LanczosSincFilter::ToString() const {
    return StringPrintf("[ LanczosSincFilter radius: %s tau: %f sampler: %s ]", radius,
                        tau, sampler);
}